

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CClient.cpp
# Opt level: O0

ssize_t __thiscall CClient::sendErrorMsg(CClient *this)

{
  allocator local_71;
  undefined1 local_70 [8];
  string ret_1;
  allocator local_39;
  undefined1 local_38 [8];
  string ret;
  CClient *this_local;
  
  ret.field_2._8_8_ = this;
  if ((int)this->m_State < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_38,"530 Please login with USER and PASS.\r\n",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local = (CClient *)sendMsg(this,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_70,"500 Unknown command.\r\n",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_local = (CClient *)sendMsg(this,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  return (ssize_t)this_local;
}

Assistant:

ssize_t CClient::sendErrorMsg() {
    if(m_State < USER){
        string ret = "530 Please login with USER and PASS.\r\n";
        return sendMsg(ret);
    }
    else{
        string ret = "500 Unknown command.\r\n";
        return sendMsg(ret);
    }
}